

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void polyscope::warning(string *baseMessage,string *detailMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  *this;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  _Map_pointer ppWVar5;
  WarningMessage *pWVar6;
  size_t sVar7;
  WarningMessage *pWVar8;
  long lVar9;
  _Map_pointer ppWVar10;
  long lVar11;
  WarningMessage *w;
  WarningMessage *pWVar12;
  pointer local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  pointer local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  int local_40;
  string *local_38;
  
  pWVar6 = DAT_004c0920;
  if (DAT_004c0900 != DAT_004c0920) {
    sVar7 = baseMessage->_M_string_length;
    bVar3 = false;
    pWVar8 = DAT_004c0910;
    pWVar12 = DAT_004c0900;
    ppWVar10 = DAT_004c0918;
    local_38 = detailMessage;
    do {
      __n = (pWVar12->baseMessage)._M_string_length;
      if ((__n == sVar7) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pWVar12->baseMessage)._M_dataplus._M_p,(baseMessage->_M_dataplus)._M_p,__n)
          , iVar4 == 0)))) {
        pWVar12->repeatCount = pWVar12->repeatCount + 1;
        bVar3 = true;
      }
      pWVar12 = pWVar12 + 1;
      if (pWVar12 == pWVar8) {
        pWVar12 = ppWVar10[1];
        ppWVar10 = ppWVar10 + 1;
        pWVar8 = pWVar12 + 7;
      }
    } while (pWVar12 != pWVar6);
    detailMessage = local_38;
    if (bVar3) {
      return;
    }
  }
  pcVar2 = (baseMessage->_M_dataplus)._M_p;
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + baseMessage->_M_string_length);
  pcVar2 = (detailMessage->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + detailMessage->_M_string_length);
  pWVar6 = DAT_004c0920;
  local_40 = 0;
  if (DAT_004c0920 != DAT_004c0930 + -1) {
    paVar1 = &(DAT_004c0920->baseMessage).field_2;
    (DAT_004c0920->baseMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_80 == &local_70) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
      *(undefined8 *)((long)&(pWVar6->baseMessage).field_2 + 8) = uStack_68;
    }
    else {
      (pWVar6->baseMessage)._M_dataplus._M_p = local_80;
      (pWVar6->baseMessage).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    }
    (pWVar6->baseMessage)._M_string_length = local_78;
    paVar1 = &(pWVar6->detailMessage).field_2;
    (pWVar6->detailMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_60 == &local_50) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)((long)&(pWVar6->detailMessage).field_2 + 8) = uStack_48;
    }
    else {
      (pWVar6->detailMessage)._M_dataplus._M_p = local_60;
      (pWVar6->detailMessage).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    }
    (pWVar6->detailMessage)._M_string_length = local_58;
    pWVar6->repeatCount = 0;
    DAT_004c0920 = DAT_004c0920 + 1;
    return;
  }
  lVar9 = (long)DAT_004c0938 - (long)DAT_004c0918 >> 3;
  if (((long)DAT_004c0910 - (long)DAT_004c0900 >> 3) * -0x71c71c71c71c71c7 +
      ((long)DAT_004c0920 - (long)_DAT_004c0928 >> 3) * -0x71c71c71c71c71c7 +
      (lVar9 + -1 + (ulong)(DAT_004c0938 == (_Map_pointer)0x0)) * 7 == 0x1c71c71c71c71c7) {
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  if (1 < (ulong)((long)DAT_004c08f8 -
                 ((long)DAT_004c0938 - (long)(anonymous_namespace)::warningMessages >> 3)))
  goto LAB_001cc94a;
  if ((_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
       *)(lVar9 * 2 + 4) < DAT_004c08f8) {
    ppWVar10 = (anonymous_namespace)::warningMessages +
               ((ulong)((long)DAT_004c08f8 - (lVar9 + 2)) >> 1);
    if (ppWVar10 < DAT_004c0918) {
      sVar7 = (long)DAT_004c0938 + (8 - (long)DAT_004c0918);
      ppWVar5 = ppWVar10;
      if (sVar7 != 0) {
LAB_001cc905:
        memmove(ppWVar5,DAT_004c0918,sVar7);
      }
    }
    else {
      sVar7 = (long)DAT_004c0938 + (8 - (long)DAT_004c0918);
      if (sVar7 != 0) {
        ppWVar5 = (_Map_pointer)((long)ppWVar10 + ((lVar9 + 1) * 8 - sVar7));
        goto LAB_001cc905;
      }
    }
  }
  else {
    lVar11 = (long)DAT_004c08f8 * 2 +
             (ulong)(DAT_004c08f8 ==
                    (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                     *)0x0);
    this = (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
            *)(lVar11 + 2);
    ppWVar5 = std::
              _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
              ::_M_allocate_map(this,(size_t)DAT_004c0918);
    ppWVar10 = ppWVar5 + ((ulong)(lVar11 - lVar9) >> 1);
    sVar7 = (long)DAT_004c0938 + (8 - (long)DAT_004c0918);
    if (sVar7 != 0) {
      memmove(ppWVar10,DAT_004c0918,sVar7);
    }
    operator_delete((anonymous_namespace)::warningMessages);
    (anonymous_namespace)::warningMessages = ppWVar5;
    DAT_004c08f8 = this;
  }
  _DAT_004c0908 = *ppWVar10;
  DAT_004c0910 = _DAT_004c0908 + 7;
  DAT_004c0938 = ppWVar10 + lVar9;
  _DAT_004c0928 = *DAT_004c0938;
  DAT_004c0930 = _DAT_004c0928 + 7;
  DAT_004c0918 = ppWVar10;
LAB_001cc94a:
  pWVar6 = (WarningMessage *)operator_new(0x1f8);
  DAT_004c0938[1] = pWVar6;
  paVar1 = &(DAT_004c0920->baseMessage).field_2;
  (DAT_004c0920->baseMessage)._M_dataplus._M_p = (pointer)paVar1;
  if (local_80 == &local_70) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)((long)&(DAT_004c0920->baseMessage).field_2 + 8) = uStack_68;
  }
  else {
    (DAT_004c0920->baseMessage)._M_dataplus._M_p = local_80;
    (DAT_004c0920->baseMessage).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
  }
  (DAT_004c0920->baseMessage)._M_string_length = local_78;
  paVar1 = &(DAT_004c0920->detailMessage).field_2;
  (DAT_004c0920->detailMessage)._M_dataplus._M_p = (pointer)paVar1;
  if (local_60 == &local_50) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&(DAT_004c0920->detailMessage).field_2 + 8) = uStack_48;
  }
  else {
    (DAT_004c0920->detailMessage)._M_dataplus._M_p = local_60;
    (DAT_004c0920->detailMessage).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  (DAT_004c0920->detailMessage)._M_string_length = local_58;
  DAT_004c0920->repeatCount = local_40;
  _DAT_004c0928 = DAT_004c0938[1];
  DAT_004c0938 = DAT_004c0938 + 1;
  DAT_004c0930 = _DAT_004c0928 + 7;
  DAT_004c0920 = _DAT_004c0928;
  return;
}

Assistant:

void warning(std::string baseMessage, std::string detailMessage) {

  // Look for a message with the same name
  bool found = false;
  for (WarningMessage& w : warningMessages) {
    if (w.baseMessage == baseMessage) {
      found = true;
      w.repeatCount++;
    }
  }

  // Create a new message
  if (!found) {
    warningMessages.push_back(WarningMessage{baseMessage, detailMessage, 0});
  }
}